

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::Stack
          (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *this,size_t initialCapacity)

{
  BottomUpChildIter<Kernel::PolyNf> *pBVar1;
  size_t sVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    sVar2 = 0;
    pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
  }
  else {
    pBVar1 = (BottomUpChildIter<Kernel::PolyNf> *)Lib::alloc(initialCapacity * 0x24);
    sVar2 = this->_capacity;
  }
  this->_stack = pBVar1;
  this->_cursor = pBVar1;
  this->_end = pBVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }